

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::has_crlf(string *s)

{
  char *p;
  char *local_18;
  
  local_18 = (char *)std::__cxx11::string::c_str();
  while( true ) {
    if (*local_18 == '\0') {
      return false;
    }
    if ((*local_18 == '\r') || (*local_18 == '\n')) break;
    local_18 = local_18 + 1;
  }
  return true;
}

Assistant:

inline bool has_crlf(const std::string& s) {
            auto p = s.c_str();
            while (*p) {
                if (*p == '\r' || *p == '\n') { return true; }
                p++;
            }
            return false;
        }